

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::TestChildExtensionData::Clear(TestChildExtensionData *this)

{
  TestChildExtensionData_NestedTestAllExtensionsData *this_00;
  anon_union_32_1_493b367e_for_TestChildExtensionData_3 aVar1;
  LogMessageFatal local_20;
  
  aVar1 = this->field_0;
  if (((undefined1  [32])aVar1 & (undefined1  [32])0x7) != (undefined1  [32])0x0) {
    if (((undefined1  [32])aVar1 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.a_)
      ;
    }
    if (((undefined1  [32])aVar1 & (undefined1  [32])0x2) != (undefined1  [32])0x0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.b_)
      ;
    }
    if (((undefined1  [32])aVar1 & (undefined1  [32])0x4) != (undefined1  [32])0x0) {
      this_00 = (this->field_0)._impl_.optional_extension_;
      if (this_00 == (TestChildExtensionData_NestedTestAllExtensionsData *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest.pb.cc"
                   ,0x3d16,"_impl_.optional_extension_ != nullptr");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      TestChildExtensionData_NestedTestAllExtensionsData::Clear(this_00);
    }
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestChildExtensionData::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestChildExtensionData)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.a_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.b_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(_impl_.optional_extension_ != nullptr);
      _impl_.optional_extension_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}